

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void mp::
     WriteExpr<mp::internal::ExprTypes,mp::LinearExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
               (Writer *w,LinearExpr *linear,
               BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> nonlinear,VarNamer vnam)

{
  double value;
  ptr pTVar1;
  size_ty sVar2;
  BasicStringRef<char> value_00;
  bool bVar3;
  bool bVar4;
  BasicWriter<char> *this;
  string *psVar5;
  long lVar6;
  BasicStringRef<char> value_01;
  BasicStringRef<char> value_02;
  BasicStringRef<char> value_03;
  BasicStringRef<char> value_04;
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
  local_50;
  
  pTVar1 = (linear->terms_).super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data
           .super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr;
  sVar2 = (linear->terms_).super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
          super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_size;
  bVar3 = false;
  for (lVar6 = 0; sVar2 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
    value = *(double *)((long)&pTVar1->coef_ + lVar6);
    if ((value != 0.0) || (NAN(value))) {
      bVar4 = true;
      if (bVar3) {
        value_01.size_ = 3;
        value_01.data_ = " + ";
        fmt::BasicWriter<char>::operator<<(w,value_01);
        bVar4 = bVar3;
      }
      if ((value != 1.0) || (NAN(value))) {
        this = fmt::BasicWriter<char>::operator<<(w,value);
        value_02.size_ = 3;
        value_02.data_ = " * ";
        fmt::BasicWriter<char>::operator<<(this,value_02);
      }
      psVar5 = BasicProblem<mp::BasicProblemParams<int>>::var_name_abi_cxx11_
                         ((BasicProblem<mp::BasicProblemParams<int>> *)vnam.p_,
                          *(int *)((long)&pTVar1->var_index_ + lVar6));
      value_00.data_ = (psVar5->_M_dataplus)._M_p;
      value_00.size_ = psVar5->_M_string_length;
      fmt::BasicWriter<char>::operator<<(w,value_00);
      bVar3 = bVar4;
    }
  }
  if ((nonlinear.super_ExprBase.impl_ == (Impl *)0x0) ||
     (((*(int *)nonlinear.super_ExprBase.impl_ == 1 &&
       (*(double *)((long)nonlinear.super_ExprBase.impl_ + 8) == 0.0)) &&
      (!NAN(*(double *)((long)nonlinear.super_ExprBase.impl_ + 8)))))) {
    if (!bVar3) {
      value_03.size_ = 1;
      value_03.data_ = "0";
      fmt::BasicWriter<char>::operator<<(w,value_03);
      return;
    }
  }
  else {
    if (bVar3) {
      value_04.size_ = 3;
      value_04.data_ = " + ";
      fmt::BasicWriter<char>::operator<<(w,value_04);
    }
    local_50.
    super_BasicExprVisitor<mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>,_void,_mp::internal::ExprTypes>
    ._vptr_BasicExprVisitor = (_func_int **)&PTR__BasicExprVisitor_00264e20;
    local_50.precedence_ = 0;
    local_50.writer_ = w;
    local_50.vnam_.p_ = vnam.p_;
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    Visit(&local_50,(NumericExpr)nonlinear.super_ExprBase.impl_,-1);
  }
  return;
}

Assistant:

void WriteExpr(fmt::Writer &w, const LinearExpr &linear,
               NumericExpr nonlinear, Namer vnam={}) {
  bool have_terms = false;
  for (auto i = linear.begin(), e = linear.end(); i != e; ++i) {
    double coef = i->coef();
    if (coef != 0) {
      if (have_terms)
        w << " + ";
      else
        have_terms = true;
      if (coef != 1)
        w << coef << " * ";
      w << vnam.vname(i->var_index());
    }
  }
  if (!nonlinear || IsZero<ExprTypes>(nonlinear)) {
    if (!have_terms)
      w << "0";
    return;
  }
  if (have_terms)
    w << " + ";
  ExprWriter<ExprTypes, Namer>(w, vnam).Visit(nonlinear);
}